

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playera.cpp
# Opt level: O3

void SampleConv_toS24(void *buffer,INT32 value)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 0x7fffff;
  if (value < 0x7fffff) {
    iVar2 = value;
  }
  iVar1 = -0x800000;
  if (-0x800000 < iVar2) {
    iVar1 = iVar2;
  }
  *(char *)buffer = (char)iVar1;
  *(char *)((long)buffer + 1) = (char)((uint)iVar1 >> 8);
  *(char *)((long)buffer + 2) = (char)((uint)iVar1 >> 0x10);
  return;
}

Assistant:

static void SampleConv_toS24(void* buffer, INT32 value)
{
	UINT8 tmp[3];
	if (value < -0x800000)
		value = -0x800000;
	else if (value > +0x7FFFFF)
		value = +0x7FFFFF;
#if defined(VGM_LITTLE_ENDIAN)
	tmp[0] = ( value       ) & 0xFF;
	tmp[1] = ( value >> 8  ) & 0xFF;
	tmp[2] = ( value >> 16 ) & 0xFF;
#elif defined(VGM_BIG_ENDIAN)
	tmp[0] = ( value >> 16 ) & 0xFF;
	tmp[1] = ( value >> 8  ) & 0xFF;
	tmp[2] = ( value       ) & 0xFF;
#else
#error unknown endianness
#endif
	memcpy(buffer,tmp,sizeof(tmp));
	return;
}